

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void run_ixor_test(void)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *container_03;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  unsigned_long uVar4;
  run_container_t *prVar5;
  bitset_container_t *pbVar6;
  array_container_t *paVar7;
  run_container_t *prVar8;
  int iVar9;
  int iVar10;
  array_container_t *paVar11;
  ushort uVar12;
  int x;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint16_t pos;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong unaff_R14;
  ulong uVar19;
  container_t *C;
  array_container_t *local_48;
  bitset_container_t *local_40;
  run_container_t *local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  container_03 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  local_40 = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar15 = 0;
  local_38 = run_container_create();
  do {
    if ((uint)((int)uVar15 + (int)(uVar15 / 5) * -5) < 3) {
      iVar14 = container->cardinality;
      uVar12 = (ushort)uVar15;
      if (((long)iVar14 == 0) ||
         ((iVar14 != 0x7fffffff && (container->array[(long)iVar14 + -1] < uVar12)))) {
        if (iVar14 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        iVar14 = container->cardinality;
        container->cardinality = iVar14 + 1;
        container->array[iVar14] = uVar12;
      }
      else {
        iVar9 = iVar14 + -1;
        uVar13 = 0;
        uVar19 = unaff_R14;
        do {
          if (iVar9 < (int)uVar13) {
            unaff_R14 = (ulong)~uVar13;
            break;
          }
          uVar17 = uVar13 + iVar9 >> 1;
          unaff_R14 = (ulong)uVar17;
          uVar1 = *(ushort *)((long)container->array + (ulong)(uVar13 + iVar9 & 0xfffffffe));
          if (uVar1 < uVar12) {
            uVar13 = uVar17 + 1;
            bVar2 = true;
            unaff_R14 = uVar19;
          }
          else if (uVar12 < uVar1) {
            iVar9 = uVar17 - 1;
            bVar2 = true;
            unaff_R14 = uVar19;
          }
          else {
            bVar2 = false;
          }
          uVar19 = unaff_R14;
        } while (bVar2);
        if ((iVar14 != 0x7fffffff) && ((int)(uint)unaff_R14 < 0)) {
          if (iVar14 == container->capacity) {
            array_container_grow(container,container->capacity + 1,true);
          }
          uVar13 = ~(uint)unaff_R14;
          unaff_R14 = (ulong)uVar13;
          memmove(container->array + unaff_R14 + 1,container->array + unaff_R14,
                  (long)(int)(iVar14 - uVar13) * 2);
          container->array[unaff_R14] = uVar12;
          container->cardinality = container->cardinality + 1;
        }
      }
      uVar19 = src_2->words[uVar15 >> 6];
      uVar18 = uVar19 | 1L << (uVar15 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar19 ^ uVar18) >> ((byte)uVar15 & 0x3f));
      src_2->words[uVar15 >> 6] = uVar18;
      run_container_add(run,uVar12);
    }
    uVar13 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar15 = 0;
  do {
    if ((uint)((int)((uVar15 >> 1) / 0x1f) * -0x3f + (int)((uVar15 >> 1) / 0x1f) + (int)uVar15) <
        0x25) {
      iVar14 = container_00->cardinality;
      uVar12 = (ushort)uVar15;
      if (((long)iVar14 == 0) ||
         ((iVar14 != 0x7fffffff && (container_00->array[(long)iVar14 + -1] < uVar12)))) {
        if (iVar14 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        iVar14 = container_00->cardinality;
        container_00->cardinality = iVar14 + 1;
        container_00->array[iVar14] = uVar12;
      }
      else {
        iVar9 = iVar14 + -1;
        uVar13 = 0;
        uVar19 = unaff_R14;
        do {
          if (iVar9 < (int)uVar13) {
            unaff_R14 = (ulong)~uVar13;
            break;
          }
          uVar17 = uVar13 + iVar9 >> 1;
          unaff_R14 = (ulong)uVar17;
          uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar13 + iVar9 & 0xfffffffe));
          if (uVar1 < uVar12) {
            uVar13 = uVar17 + 1;
            bVar2 = true;
            unaff_R14 = uVar19;
          }
          else if (uVar12 < uVar1) {
            iVar9 = uVar17 - 1;
            bVar2 = true;
            unaff_R14 = uVar19;
          }
          else {
            bVar2 = false;
          }
          uVar19 = unaff_R14;
        } while (bVar2);
        if ((iVar14 != 0x7fffffff) && ((int)(uint)unaff_R14 < 0)) {
          if (iVar14 == container_00->capacity) {
            array_container_grow(container_00,container_00->capacity + 1,true);
          }
          uVar13 = ~(uint)unaff_R14;
          unaff_R14 = (ulong)uVar13;
          memmove(container_00->array + unaff_R14 + 1,container_00->array + unaff_R14,
                  (long)(int)(iVar14 - uVar13) * 2);
          container_00->array[unaff_R14] = uVar12;
          container_00->cardinality = container_00->cardinality + 1;
        }
      }
      uVar19 = src_2_00->words[uVar15 >> 6];
      uVar18 = uVar19 | 1L << (uVar15 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar19 ^ uVar18) >> ((byte)uVar15 & 0x3f));
      src_2_00->words[uVar15 >> 6] = uVar18;
      run_container_add(run_00,uVar12);
    }
    uVar13 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar15 = 0;
  do {
    iVar14 = (int)uVar15;
    if ((uint)((int)((uVar15 >> 1) / 0x1f) * -0x3f + (int)((uVar15 >> 1) / 0x1f) + iVar14) < 0x25 !=
        (uint)(iVar14 + (int)(uVar15 / 5) * -5) < 3) {
      iVar9 = container_03->cardinality;
      uVar12 = (ushort)uVar15;
      if (((long)iVar9 == 0) ||
         ((iVar9 != 0x7fffffff && (container_03->array[(long)iVar9 + -1] < uVar12)))) {
        if (iVar9 == container_03->capacity) {
          array_container_grow(container_03,container_03->capacity + 1,true);
        }
        iVar9 = container_03->cardinality;
        container_03->cardinality = iVar9 + 1;
        container_03->array[iVar9] = uVar12;
      }
      else {
        iVar10 = iVar9 + -1;
        uVar13 = 0;
        paVar7 = container_03;
        do {
          if (iVar10 < (int)uVar13) {
            uVar17 = ~uVar13;
            break;
          }
          uVar17 = uVar13 + iVar10 >> 1;
          paVar11 = (array_container_t *)(ulong)uVar17;
          uVar1 = *(ushort *)((long)container_03->array + (ulong)(uVar13 + iVar10 & 0xfffffffe));
          if (uVar1 < uVar12) {
            uVar13 = uVar17 + 1;
            bVar2 = true;
            paVar11 = paVar7;
          }
          else if (uVar12 < uVar1) {
            iVar10 = uVar17 - 1;
            bVar2 = true;
            paVar11 = paVar7;
          }
          else {
            bVar2 = false;
          }
          uVar17 = (uint)paVar11;
          paVar7 = paVar11;
        } while (bVar2);
        if ((iVar9 != 0x7fffffff) && ((int)uVar17 < 0)) {
          if (iVar9 == container_03->capacity) {
            array_container_grow(container_03,container_03->capacity + 1,true);
          }
          uVar17 = ~uVar17;
          memmove(container_03->array + (ulong)uVar17 + 1,container_03->array + uVar17,
                  (long)(int)(iVar9 - uVar17) * 2);
          container_03->array[uVar17] = uVar12;
          container_03->cardinality = container_03->cardinality + 1;
        }
      }
      uVar19 = local_40->words[uVar15 >> 6];
      uVar18 = uVar19 | 1L << (uVar15 & 0x3f);
      local_40->cardinality =
           local_40->cardinality + (int)((uVar19 ^ uVar18) >> ((byte)uVar15 & 0x3f));
      local_40->words[uVar15 >> 6] = uVar18;
    }
    uVar15 = (ulong)(iVar14 + 1U);
  } while (iVar14 + 1U != 0x10000);
  uVar15 = 0;
  paVar7 = container_03;
  do {
    uVar17 = (uint)uVar15;
    uVar13 = uVar17 + (int)(uVar15 / 5) * -5;
    if ((uVar13 < 2) || (10000 < uVar17 && uVar13 == 2)) {
      iVar14 = container_01->cardinality;
      uVar12 = (ushort)uVar15;
      if (((long)iVar14 == 0) ||
         ((iVar14 != 0x7fffffff && (container_01->array[(long)iVar14 + -1] < uVar12)))) {
        if (iVar14 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        iVar14 = container_01->cardinality;
        container_01->cardinality = iVar14 + 1;
        container_01->array[iVar14] = uVar12;
      }
      else {
        iVar9 = iVar14 + -1;
        uVar13 = 0;
        paVar11 = paVar7;
        do {
          if (iVar9 < (int)uVar13) {
            paVar7 = (array_container_t *)(ulong)~uVar13;
            break;
          }
          uVar16 = uVar13 + iVar9 >> 1;
          paVar7 = (array_container_t *)(ulong)uVar16;
          uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar13 + iVar9 & 0xfffffffe));
          if (uVar1 < uVar12) {
            uVar13 = uVar16 + 1;
            bVar2 = true;
            paVar7 = paVar11;
          }
          else if (uVar12 < uVar1) {
            iVar9 = uVar16 - 1;
            bVar2 = true;
            paVar7 = paVar11;
          }
          else {
            bVar2 = false;
          }
          paVar11 = paVar7;
        } while (bVar2);
        if ((iVar14 != 0x7fffffff) && ((int)(uint)paVar7 < 0)) {
          if (iVar14 == container_01->capacity) {
            array_container_grow(container_01,container_01->capacity + 1,true);
          }
          uVar13 = ~(uint)paVar7;
          paVar7 = (array_container_t *)(ulong)uVar13;
          memmove(container_01->array + (long)((long)&paVar7->cardinality + 1),
                  container_01->array + (long)paVar7,(long)(int)(iVar14 - uVar13) * 2);
          container_01->array[(long)paVar7] = uVar12;
          container_01->cardinality = container_01->cardinality + 1;
        }
      }
      uVar19 = src_2_01->words[uVar15 >> 6];
      uVar18 = uVar19 | 1L << (uVar15 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar19 ^ uVar18) >> ((byte)uVar15 & 0x3f));
      src_2_01->words[uVar15 >> 6] = uVar18;
      run_container_add(run_01,uVar12);
    }
    uVar15 = (ulong)(uVar17 + 1);
  } while (uVar17 + 1 != 0x10000);
  uVar13 = 1;
  iVar14 = 0;
  do {
    if ((uVar13 & 3) != 0) {
      pos = (uint16_t)iVar14;
      run_container_add(local_38,pos);
      iVar9 = container_02->cardinality;
      if (((long)iVar9 == 0) ||
         ((iVar9 != 0x7fffffff && (container_02->array[(long)iVar9 + -1] < pos)))) {
        if (iVar9 == container_02->capacity) {
          array_container_grow(container_02,container_02->capacity + 1,true);
        }
        iVar9 = container_02->cardinality;
        container_02->cardinality = iVar9 + 1;
        container_02->array[iVar9] = pos;
      }
      else {
        iVar10 = iVar9 + -1;
        uVar17 = 0;
        do {
          if (iVar10 < (int)uVar17) {
            paVar7 = (array_container_t *)(ulong)~uVar17;
            break;
          }
          uVar16 = uVar17 + iVar10 >> 1;
          uVar12 = *(ushort *)((long)container_02->array + (ulong)(uVar17 + iVar10 & 0xfffffffe));
          if (uVar12 < pos) {
            uVar17 = uVar16 + 1;
            bVar2 = true;
          }
          else if (pos < uVar12) {
            iVar10 = uVar16 - 1;
            bVar2 = true;
          }
          else {
            bVar2 = false;
            paVar7 = (array_container_t *)(ulong)uVar16;
          }
        } while (bVar2);
        if ((iVar9 != 0x7fffffff) && ((int)(uint)paVar7 < 0)) {
          if (iVar9 == container_02->capacity) {
            array_container_grow(container_02,container_02->capacity + 1,true);
          }
          uVar17 = ~(uint)paVar7;
          paVar7 = (array_container_t *)(ulong)uVar17;
          memmove(container_02->array + (long)((long)&paVar7->cardinality + 1),
                  container_02->array + (long)paVar7,(long)(int)(iVar9 - uVar17) * 2);
          container_02->array[(long)paVar7] = pos;
          container_02->cardinality = container_02->cardinality + 1;
        }
      }
    }
    uVar13 = (uVar13 * 0xd68 + 0x1a85) % 0x26f5;
    iVar14 = iVar14 + 1;
    if (iVar14 == 0x10000) {
      uVar4 = (unsigned_long)container_03->cardinality;
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      _Var3 = run_bitset_container_ixor(prVar5,src_2,&local_48);
      _assert_true((ulong)!_Var3,"run_bitset_container_ixor(temp_r, B1, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3b4);
      _assert_int_equal(0,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3b5);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      pbVar6 = bitset_container_create();
      bitset_container_copy(src_2,pbVar6);
      _Var3 = bitset_run_container_ixor(pbVar6,run,&local_48);
      _assert_true((ulong)!_Var3,"bitset_run_container_ixor(temp_b, R1, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3bb);
      _assert_int_equal(0,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3bc);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      paVar7 = array_container_clone(container);
      iVar14 = array_run_container_ixor(paVar7,run,&local_48);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c2);
      _assert_int_equal(0,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c3);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      iVar14 = run_array_container_ixor(prVar5,container,&local_48);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c9);
      _assert_int_equal(0,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3ca);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar5,run,&local_48);
      _assert_int_not_equal
                (1,(long)iVar14,
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                 ,0x3d2);
      if (iVar14 == 3) {
        iVar14 = run_container_cardinality((run_container_t *)local_48);
        _assert_int_equal(0,(long)iVar14,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x3d4);
        run_container_free((run_container_t *)local_48);
      }
      else {
        _assert_int_equal(0,(long)local_48->cardinality,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x3d7);
        array_container_free(local_48);
      }
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      _Var3 = run_bitset_container_ixor(prVar5,src_2_01,&local_48);
      _assert_true((ulong)!_Var3,"run_bitset_container_ixor(temp_r, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3dd);
      _assert_int_equal(2000,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3de);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      paVar7 = array_container_clone(container_01);
      iVar14 = array_run_container_ixor(paVar7,run,&local_48);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3e4);
      _assert_int_equal(2000,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3e5);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      pbVar6 = bitset_container_create();
      bitset_container_copy(src_2,pbVar6);
      _Var3 = bitset_run_container_ixor(pbVar6,run_01,&local_48);
      _assert_true((ulong)!_Var3,"bitset_run_container_ixor(temp_b, R3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3eb);
      _assert_int_equal(2000,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3ec);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run_01);
      iVar14 = run_array_container_ixor(prVar5,container,&local_48);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f2);
      _assert_int_equal(2000,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f3);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar5,run_01,&local_48);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f9);
      _assert_int_equal(2000,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3fa);
      array_container_free(local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      _Var3 = run_bitset_container_ixor(prVar5,src_2_00,&local_48);
      _assert_true((ulong)_Var3,"run_bitset_container_ixor(temp_r, B2, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3ff);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x400);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      paVar7 = array_container_clone(container_00);
      iVar14 = array_run_container_ixor(paVar7,run,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x406);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x407);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      pbVar6 = bitset_container_create();
      bitset_container_copy(src_2,pbVar6);
      _Var3 = bitset_run_container_ixor(pbVar6,run_00,&local_48);
      _assert_true((ulong)_Var3,"bitset_run_container_ixor(temp_b, R2, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x40d);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x40e);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      iVar14 = run_array_container_ixor(prVar5,container_00,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x414);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x415);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      prVar5 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar5,run_00,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x41b);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x41c);
      bitset_container_free((bitset_container_t *)local_48);
      prVar5 = local_38;
      local_48 = (array_container_t *)0x0;
      prVar8 = run_container_clone(local_38);
      _Var3 = run_bitset_container_ixor(prVar8,src_2_01,&local_48);
      _assert_true((ulong)_Var3,"run_bitset_container_ixor(temp_r, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x421);
      uVar4 = (unsigned_long)local_48->cardinality;
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      paVar7 = array_container_clone(container_01);
      iVar14 = array_run_container_ixor(paVar7,prVar5,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x429);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x42b);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      pbVar6 = bitset_container_create();
      bitset_container_copy(src_2_01,pbVar6);
      _Var3 = bitset_run_container_ixor(pbVar6,prVar5,&local_48);
      _assert_true((ulong)_Var3,"bitset_run_container_ixor(temp_b, R4, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x431);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x432);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      prVar8 = run_container_clone(run_01);
      iVar14 = run_array_container_ixor(prVar8,container_02,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x438);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x439);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      prVar8 = run_container_clone(prVar5);
      iVar14 = run_run_container_ixor(prVar8,run_01,&local_48);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x43f);
      _assert_int_equal(uVar4,(long)local_48->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x440);
      bitset_container_free((bitset_container_t *)local_48);
      local_48 = (array_container_t *)0x0;
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_03);
      array_container_free(container_02);
      bitset_container_free(src_2);
      bitset_container_free(src_2_00);
      bitset_container_free(src_2_01);
      bitset_container_free(local_40);
      run_container_free(run);
      run_container_free(run_00);
      run_container_free(run_01);
      run_container_free(prVar5);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(run_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    run_container_t* temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    bitset_container_t* temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    array_container_t* temp_a = array_container_clone(A1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    temp_r = run_container_clone(R1);
    int ret_type = run_run_container_ixor(temp_r, R1, &C);
    assert_int_not_equal(BITSET_CONTAINER_TYPE, ret_type);
    if (ret_type == RUN_CONTAINER_TYPE) {
        assert_int_equal(0, run_container_cardinality(CAST_run(C)));
        run_container_free(CAST_run(C));
    } else {
        assert_int_equal(0, array_container_cardinality(CAST_array(C)));
        array_container_free(CAST_array(C));
    }
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_true(run_bitset_container_ixor(temp_r, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A2);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_true(run_bitset_container_ixor(temp_r, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B3, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A4);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}